

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void renameColumnFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  undefined8 uVar1;
  char *zOld_00;
  Select *p;
  int iVar2;
  int bQuote_00;
  int iVar3;
  int iVar4;
  uchar *zSql_00;
  uchar *zDatabase;
  uchar *zName;
  uchar *zNew_00;
  Parse *pPVar5;
  Expr *pExpr_00;
  Parse *pPVar6;
  int local_2c0;
  int local_2bc;
  ExprList *pUpsertSet;
  Table *pTarget;
  TriggerStep *pStep;
  Expr *pExpr;
  FKey *pFKey;
  int bFKOnly;
  Select *pSelect;
  sqlite3_xauth xAuth;
  Table *pTab;
  Table *pTStack_268;
  int i;
  Index *pIdx;
  Walker sWalker;
  Parse sParse;
  int rc;
  char *zOld;
  int bTemp;
  int bQuote;
  char *zNew;
  int iCol;
  char *zTable;
  char *zDb;
  char *zSql;
  RenameCtx sCtx;
  sqlite3 *db;
  sqlite3_value **argv_local;
  int NotUsed_local;
  sqlite3_context *context_local;
  
  sCtx.zOld = (char *)sqlite3_context_db_handle(context);
  zSql_00 = sqlite3_value_text(*argv);
  zDatabase = sqlite3_value_text(argv[3]);
  zName = sqlite3_value_text(argv[4]);
  iVar2 = sqlite3_value_int(argv[5]);
  zNew_00 = sqlite3_value_text(argv[6]);
  bQuote_00 = sqlite3_value_int(argv[7]);
  iVar3 = sqlite3_value_int(argv[8]);
  uVar1 = *(undefined8 *)(sCtx.zOld + 0x1f8);
  if (zSql_00 == (uchar *)0x0) {
    return;
  }
  if (zName == (uchar *)0x0) {
    return;
  }
  if (zNew_00 == (uchar *)0x0) {
    return;
  }
  if (iVar2 < 0) {
    return;
  }
  sqlite3BtreeEnterAll((sqlite3 *)sCtx.zOld);
  pPVar5 = (Parse *)sqlite3FindTable((sqlite3 *)sCtx.zOld,(char *)zName,(char *)zDatabase);
  if ((pPVar5 == (Parse *)0x0) || (*(i16 *)((long)&pPVar5->nTab + 2) <= iVar2)) {
    sqlite3BtreeLeaveAll((sqlite3 *)sCtx.zOld);
    return;
  }
  zOld_00 = ((Column *)pPVar5->zErrMsg)[iVar2].zCnName;
  memset(&zSql,0,0x20);
  local_2bc = iVar2;
  if (iVar2 == (short)pPVar5->nTab) {
    local_2bc = -1;
  }
  sCtx.pList._4_4_ = local_2bc;
  sCtx.zOld[0x1f8] = '\0';
  sCtx.zOld[0x1f9] = '\0';
  sCtx.zOld[0x1fa] = '\0';
  sCtx.zOld[0x1fb] = '\0';
  sCtx.zOld[0x1fc] = '\0';
  sCtx.zOld[0x1fd] = '\0';
  sCtx.zOld[0x1fe] = '\0';
  sCtx.zOld[0x1ff] = '\0';
  sParse.pRename._4_4_ =
       renameParseSql((Parse *)&sWalker.u,(char *)zDatabase,(sqlite3 *)sCtx.zOld,(char *)zSql_00,
                      iVar3);
  memset(&pIdx,0,0x30);
  pIdx = (Index *)&sWalker.u;
  sWalker.pParse = (Parse *)renameColumnExprCb;
  sWalker.xExprCallback = renameColumnSelectCb;
  sWalker._32_8_ = &zSql;
  sCtx._8_8_ = pPVar5;
  if (sParse.pRename._4_4_ == 0) {
    if (sParse.zTail == (char *)0x0) {
      if (sParse.pNewTable == (Table *)0x0) {
        sParse.pRename._4_4_ = renameResolveTrigger((Parse *)&sWalker.u);
        if (sParse.pRename._4_4_ != 0) goto LAB_001decd5;
        for (pTarget = (Table *)(sParse.pNewIndex)->aSortOrder; pTarget != (Table *)0x0;
            pTarget = (Table *)(pTarget->u).tab.pDfltList) {
          if ((pTarget->zColAff != (char *)0x0) &&
             (pPVar6 = (Parse *)sqlite3LocateTable((Parse *)&sWalker.u,0,pTarget->zColAff,
                                                   (char *)zDatabase), pPVar6 == pPVar5)) {
            if ((pTarget->u).view.pSelect != (Select *)0x0) {
              renameColumnElistNames
                        ((Parse *)&sWalker.u,(RenameCtx *)&zSql,
                         *(ExprList **)&((pTarget->u).view.pSelect)->selId,zOld_00);
            }
            renameColumnIdlistNames
                      ((Parse *)&sWalker.u,(RenameCtx *)&zSql,*(IdList **)&pTarget->nNVCol,zOld_00);
            renameColumnElistNames
                      ((Parse *)&sWalker.u,(RenameCtx *)&zSql,*(ExprList **)&pTarget->tabFlags,
                       zOld_00);
          }
        }
        if (sParse.pToplevel == pPVar5) {
          renameColumnIdlistNames
                    ((Parse *)&sWalker.u,(RenameCtx *)&zSql,(IdList *)(sParse.pNewIndex)->zColAff,
                     zOld_00);
        }
        renameWalkTrigger((Walker *)&pIdx,(Trigger *)sParse.pNewIndex);
      }
      else {
        sqlite3WalkExprList((Walker *)&pIdx,((sParse.pNewTable)->u).tab.pDfltList);
        sqlite3WalkExpr((Walker *)&pIdx,(Expr *)((sParse.pNewTable)->u).tab.pFKey);
      }
    }
    else if (sParse.zTail[0x3f] == '\x02') {
      p = *(Select **)(sParse.zTail + 0x40);
      p->selFlags = p->selFlags & 0xffdfffff;
      sqlite3SelectPrep((Parse *)&sWalker.u,p,(NameContext *)0x0);
      if (sCtx.zOld[0x67] == '\0') {
        local_2c0 = 0;
      }
      else {
        local_2c0 = 7;
      }
      sParse.pRename._4_4_ = local_2c0;
      if (local_2c0 != 0) goto LAB_001decd5;
      sqlite3WalkSelect((Walker *)&pIdx,p);
    }
    else if (sParse.zTail[0x3f] == '\0') {
      iVar3 = sqlite3_stricmp((char *)zName,*(char **)sParse.zTail);
      sCtx._8_8_ = sParse.zTail;
      if (iVar3 == 0) {
        if (iVar2 < *(short *)(sParse.zTail + 0x36)) {
          renameTokenFind((Parse *)&sWalker.u,(RenameCtx *)&zSql,
                          *(void **)(*(long *)(sParse.zTail + 8) + (long)iVar2 * 0x10));
        }
        if (sCtx.pList._4_4_ < 0) {
          renameTokenFind((Parse *)&sWalker.u,(RenameCtx *)&zSql,sParse.zTail + 0x34);
        }
        sqlite3WalkExprList((Walker *)&pIdx,*(ExprList **)(sParse.zTail + 0x20));
        for (pTStack_268 = *(Table **)(sParse.zTail + 0x10); pTStack_268 != (Table *)0x0;
            pTStack_268 = *(Table **)((long)pTStack_268 + 0x28)) {
          sqlite3WalkExprList((Walker *)&pIdx,*(ExprList **)((long)pTStack_268 + 0x50));
        }
        for (pTStack_268 = sParse.pNewTable; pTStack_268 != (Table *)0x0;
            pTStack_268 = *(Table **)&pTStack_268->tnum) {
          sqlite3WalkExprList((Walker *)&pIdx,(pTStack_268->u).tab.pDfltList);
        }
        for (pTab._4_4_ = 0; pTab._4_4_ < *(short *)(sParse.zTail + 0x36);
            pTab._4_4_ = pTab._4_4_ + 1) {
          pExpr_00 = sqlite3ColumnExpr((Table *)sParse.zTail,
                                       (Column *)
                                       (*(long *)(sParse.zTail + 8) + (long)pTab._4_4_ * 0x10));
          sqlite3WalkExpr((Walker *)&pIdx,pExpr_00);
        }
      }
      for (pExpr = *(Expr **)(sParse.zTail + 0x48); pExpr != (Expr *)0x0;
          pExpr = (Expr *)(pExpr->u).zToken) {
        for (pTab._4_4_ = 0; pTab._4_4_ < pExpr->nHeight; pTab._4_4_ = pTab._4_4_ + 1) {
          if ((iVar3 == 0) && ((&pExpr->y)[(long)pTab._4_4_ * 2].sub.iAddr == iVar2)) {
            renameTokenFind((Parse *)&sWalker.u,(RenameCtx *)&zSql,&pExpr->y + (long)pTab._4_4_ * 2)
            ;
          }
          iVar4 = sqlite3_stricmp((char *)pExpr->pLeft,(char *)zName);
          if ((iVar4 == 0) &&
             (iVar4 = sqlite3_stricmp(*(char **)(&pExpr[1].op + (long)pTab._4_4_ * 0x10),zOld_00),
             iVar4 == 0)) {
            renameTokenFind((Parse *)&sWalker.u,(RenameCtx *)&zSql,
                            *(void **)(&pExpr[1].op + (long)pTab._4_4_ * 0x10));
          }
        }
      }
    }
    sParse.pRename._4_4_ =
         renameEditSql(context,(RenameCtx *)&zSql,(char *)zSql_00,(char *)zNew_00,bQuote_00);
  }
LAB_001decd5:
  if (sParse.pRename._4_4_ != 0) {
    if ((sParse.pRename._4_4_ == 1) &&
       (iVar2 = sqlite3WritableSchema((sqlite3 *)sCtx.zOld), iVar2 != 0)) {
      sqlite3_result_value(context,*argv);
    }
    else if (sParse.db == (sqlite3 *)0x0) {
      sqlite3_result_error_code(context,sParse.pRename._4_4_);
    }
    else {
      renameColumnParseError(context,"",argv[1],argv[2],(Parse *)&sWalker.u);
    }
  }
  renameParseCleanup((Parse *)&sWalker.u);
  renameTokenFree((sqlite3 *)sCtx.zOld,(RenameToken *)zSql);
  *(undefined8 *)(sCtx.zOld + 0x1f8) = uVar1;
  sqlite3BtreeLeaveAll((sqlite3 *)sCtx.zOld);
  return;
}

Assistant:

static void renameColumnFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  RenameCtx sCtx;
  const char *zSql = (const char*)sqlite3_value_text(argv[0]);
  const char *zDb = (const char*)sqlite3_value_text(argv[3]);
  const char *zTable = (const char*)sqlite3_value_text(argv[4]);
  int iCol = sqlite3_value_int(argv[5]);
  const char *zNew = (const char*)sqlite3_value_text(argv[6]);
  int bQuote = sqlite3_value_int(argv[7]);
  int bTemp = sqlite3_value_int(argv[8]);
  const char *zOld;
  int rc;
  Parse sParse;
  Walker sWalker;
  Index *pIdx;
  int i;
  Table *pTab;
#ifndef SQLITE_OMIT_AUTHORIZATION
  sqlite3_xauth xAuth = db->xAuth;
#endif

  UNUSED_PARAMETER(NotUsed);
  if( zSql==0 ) return;
  if( zTable==0 ) return;
  if( zNew==0 ) return;
  if( iCol<0 ) return;
  sqlite3BtreeEnterAll(db);
  pTab = sqlite3FindTable(db, zTable, zDb);
  if( pTab==0 || iCol>=pTab->nCol ){
    sqlite3BtreeLeaveAll(db);
    return;
  }
  zOld = pTab->aCol[iCol].zCnName;
  memset(&sCtx, 0, sizeof(sCtx));
  sCtx.iCol = ((iCol==pTab->iPKey) ? -1 : iCol);

#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = 0;
#endif
  rc = renameParseSql(&sParse, zDb, db, zSql, bTemp);

  /* Find tokens that need to be replaced. */
  memset(&sWalker, 0, sizeof(Walker));
  sWalker.pParse = &sParse;
  sWalker.xExprCallback = renameColumnExprCb;
  sWalker.xSelectCallback = renameColumnSelectCb;
  sWalker.u.pRename = &sCtx;

  sCtx.pTab = pTab;
  if( rc!=SQLITE_OK ) goto renameColumnFunc_done;
  if( sParse.pNewTable ){
    if( IsView(sParse.pNewTable) ){
      Select *pSelect = sParse.pNewTable->u.view.pSelect;
      pSelect->selFlags &= ~SF_View;
      sParse.rc = SQLITE_OK;
      sqlite3SelectPrep(&sParse, pSelect, 0);
      rc = (db->mallocFailed ? SQLITE_NOMEM : sParse.rc);
      if( rc==SQLITE_OK ){
        sqlite3WalkSelect(&sWalker, pSelect);
      }
      if( rc!=SQLITE_OK ) goto renameColumnFunc_done;
    }else if( IsOrdinaryTable(sParse.pNewTable) ){
      /* A regular table */
      int bFKOnly = sqlite3_stricmp(zTable, sParse.pNewTable->zName);
      FKey *pFKey;
      sCtx.pTab = sParse.pNewTable;
      if( bFKOnly==0 ){
        if( iCol<sParse.pNewTable->nCol ){
          renameTokenFind(
              &sParse, &sCtx, (void*)sParse.pNewTable->aCol[iCol].zCnName
          );
        }
        if( sCtx.iCol<0 ){
          renameTokenFind(&sParse, &sCtx, (void*)&sParse.pNewTable->iPKey);
        }
        sqlite3WalkExprList(&sWalker, sParse.pNewTable->pCheck);
        for(pIdx=sParse.pNewTable->pIndex; pIdx; pIdx=pIdx->pNext){
          sqlite3WalkExprList(&sWalker, pIdx->aColExpr);
        }
        for(pIdx=sParse.pNewIndex; pIdx; pIdx=pIdx->pNext){
          sqlite3WalkExprList(&sWalker, pIdx->aColExpr);
        }
#ifndef SQLITE_OMIT_GENERATED_COLUMNS
        for(i=0; i<sParse.pNewTable->nCol; i++){
          Expr *pExpr = sqlite3ColumnExpr(sParse.pNewTable,
                                                  &sParse.pNewTable->aCol[i]);
          sqlite3WalkExpr(&sWalker, pExpr);
        }
#endif
      }

      assert( IsOrdinaryTable(sParse.pNewTable) );
      for(pFKey=sParse.pNewTable->u.tab.pFKey; pFKey; pFKey=pFKey->pNextFrom){
        for(i=0; i<pFKey->nCol; i++){
          if( bFKOnly==0 && pFKey->aCol[i].iFrom==iCol ){
            renameTokenFind(&sParse, &sCtx, (void*)&pFKey->aCol[i]);
          }
          if( 0==sqlite3_stricmp(pFKey->zTo, zTable)
           && 0==sqlite3_stricmp(pFKey->aCol[i].zCol, zOld)
          ){
            renameTokenFind(&sParse, &sCtx, (void*)pFKey->aCol[i].zCol);
          }
        }
      }
    }
  }else if( sParse.pNewIndex ){
    sqlite3WalkExprList(&sWalker, sParse.pNewIndex->aColExpr);
    sqlite3WalkExpr(&sWalker, sParse.pNewIndex->pPartIdxWhere);
  }else{
    /* A trigger */
    TriggerStep *pStep;
    rc = renameResolveTrigger(&sParse);
    if( rc!=SQLITE_OK ) goto renameColumnFunc_done;

    for(pStep=sParse.pNewTrigger->step_list; pStep; pStep=pStep->pNext){
      if( pStep->zTarget ){
        Table *pTarget = sqlite3LocateTable(&sParse, 0, pStep->zTarget, zDb);
        if( pTarget==pTab ){
          if( pStep->pUpsert ){
            ExprList *pUpsertSet = pStep->pUpsert->pUpsertSet;
            renameColumnElistNames(&sParse, &sCtx, pUpsertSet, zOld);
          }
          renameColumnIdlistNames(&sParse, &sCtx, pStep->pIdList, zOld);
          renameColumnElistNames(&sParse, &sCtx, pStep->pExprList, zOld);
        }
      }
    }


    /* Find tokens to edit in UPDATE OF clause */
    if( sParse.pTriggerTab==pTab ){
      renameColumnIdlistNames(&sParse, &sCtx,sParse.pNewTrigger->pColumns,zOld);
    }

    /* Find tokens to edit in various expressions and selects */
    renameWalkTrigger(&sWalker, sParse.pNewTrigger);
  }

  assert( rc==SQLITE_OK );
  rc = renameEditSql(context, &sCtx, zSql, zNew, bQuote);

renameColumnFunc_done:
  if( rc!=SQLITE_OK ){
    if( rc==SQLITE_ERROR && sqlite3WritableSchema(db) ){
      sqlite3_result_value(context, argv[0]);
    }else if( sParse.zErrMsg ){
      renameColumnParseError(context, "", argv[1], argv[2], &sParse);
    }else{
      sqlite3_result_error_code(context, rc);
    }
  }

  renameParseCleanup(&sParse);
  renameTokenFree(db, sCtx.pList);
#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = xAuth;
#endif
  sqlite3BtreeLeaveAll(db);
}